

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall
cmFileCommand::AddEvaluationFile
          (cmFileCommand *this,string *inputName,string *outputExpr,string *condition,
          bool inputIsContent)

{
  Entry **ppEVar1;
  cmMakefile *this_00;
  auto_ptr_ref<cmCompiledGeneratorExpression> r;
  auto_ptr<cmCompiledGeneratorExpression> local_e0;
  auto_ptr<cmCompiledGeneratorExpression> local_d8;
  undefined1 local_d0 [24];
  auto_ptr<cmCompiledGeneratorExpression> conditionCge;
  cmGeneratorExpression conditionGe;
  auto_ptr<cmCompiledGeneratorExpression> local_88;
  auto_ptr<cmCompiledGeneratorExpression> outputCge;
  undefined1 local_70 [8];
  cmGeneratorExpression outputGe;
  cmListFileBacktrace lfbt;
  bool inputIsContent_local;
  string *condition_local;
  string *outputExpr_local;
  string *inputName_local;
  cmFileCommand *this_local;
  
  ppEVar1 = &outputGe.Backtrace.Cur;
  cmMakefile::GetBacktrace((cmListFileBacktrace *)ppEVar1,(this->super_cmCommand).Makefile);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_70,(cmListFileBacktrace *)ppEVar1);
  cmGeneratorExpression::Parse
            ((cmGeneratorExpression *)&conditionGe.Backtrace.Cur,(string *)local_70);
  ppEVar1 = &conditionGe.Backtrace.Cur;
  r = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)ppEVar1);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_88,r);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)ppEVar1);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)&conditionCge,(cmListFileBacktrace *)&outputGe.Backtrace.Cur);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_d0,(string *)&conditionCge);
  local_d0._8_8_ = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_d0);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_d0 + 0x10),
             (auto_ptr_ref<cmCompiledGeneratorExpression>)local_d0._8_8_);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_d0);
  this_00 = (this->super_cmCommand).Makefile;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_d8,&local_88);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            (&local_e0,(auto_ptr<cmCompiledGeneratorExpression> *)(local_d0 + 0x10));
  cmMakefile::AddEvaluationFile(this_00,inputName,&local_d8,&local_e0,inputIsContent);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_e0);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_d8);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)(local_d0 + 0x10));
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&conditionCge);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_88);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_70);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&outputGe.Backtrace.Cur);
  return;
}

Assistant:

void cmFileCommand::AddEvaluationFile(const std::string& inputName,
                                      const std::string& outputExpr,
                                      const std::string& condition,
                                      bool inputIsContent)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();

  cmGeneratorExpression outputGe(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> outputCge =
    outputGe.Parse(outputExpr);

  cmGeneratorExpression conditionGe(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> conditionCge =
    conditionGe.Parse(condition);

  this->Makefile->AddEvaluationFile(inputName, outputCge, conditionCge,
                                    inputIsContent);
}